

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  Context *context;
  ushort *puVar2;
  bool bVar3;
  AlphaNum *a;
  string *this_00;
  char *pcVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string local_f0;
  AlphaNum local_d0;
  string local_a0;
  Options local_80;
  
  bVar3 = IsOwnFile<google::protobuf::ServiceDescriptor>
                    ((this->super_ServiceGenerator).descriptor_,true);
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  Options::Options(&local_80,&this->context_->options_);
  WriteServiceDocComment(printer,pSVar1,&local_80);
  Options::~Options(&local_80);
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  context = this->context_;
  pcVar4 = anon_var_dwarf_651463 + 5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,anon_var_dwarf_651463 + 5,(allocator<char> *)&local_f0);
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (context,printer,pSVar1,true,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
  }
  if (!bVar3) {
    pcVar4 = "static";
  }
  puVar2 = (ushort *)(((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_d0.piece_._M_len = (size_t)*puVar2;
  local_d0.piece_._M_str = (char *)((long)puVar2 + ~local_d0.piece_._M_len);
  text_00._M_str =
       "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n";
  text_00._M_len = 0x58;
  local_f0._M_dataplus._M_p = pcVar4;
  io::Printer::
  Print<char[7],char_const*,char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_00,(char (*) [7])"static",(char **)&local_f0,(char (*) [10])0xff9b1e,
             &local_d0.piece_);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  puVar2 = (ushort *)(((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_d0.piece_._M_len = (size_t)*puVar2;
  local_d0.piece_._M_str = (char *)((long)puVar2 + ~local_d0.piece_._M_len);
  text_01._M_str = "protected $classname$() {}\n\n";
  text_01._M_len = 0x1c;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_01,(char (*) [10])0xff9b1e,&local_d0.piece_);
  GenerateInterface(this,printer);
  GenerateNewReflectiveServiceMethod(this,printer);
  GenerateNewReflectiveBlockingServiceMethod(this,printer);
  GenerateAbstractMethods(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_f0,this->name_resolver_,((this->super_ServiceGenerator).descriptor_)->file_);
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_d0,(int)((ulong)((long)pSVar1 - (long)pSVar1->file_->services_) >> 6));
  absl::lts_20250127::StrCat_abi_cxx11_(&local_a0,(lts_20250127 *)&local_d0,a);
  text_02._M_str =
       "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
  ;
  text_02._M_len = 0x9e;
  io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
            (printer,text_02,(char (*) [5])0xf3c1e6,&local_f0,(char (*) [6])0xd9f68f,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  this_00 = &local_f0;
  std::__cxx11::string::~string((string *)this_00);
  GenerateGetDescriptorForType((ImmutableServiceGenerator *)this_00,printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  GenerateStub(this,printer);
  GenerateBlockingStub(this,printer);
  local_d0.piece_._M_str = (((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_d0.piece_._M_len = (size_t)*(ushort *)(local_d0.piece_._M_str + 2);
  local_d0.piece_._M_str = local_d0.piece_._M_str + ~local_d0.piece_._M_len;
  text_03._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_03._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_03,(char (*) [10])0x10a7999,&local_d0.piece_);
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n\n";
  text_04._M_len = 3;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  printer->Print(
      "public $static$ abstract class $classname$\n"
      "    implements com.google.protobuf.Service {\n",
      "static", is_own_file ? "" : "static", "classname", descriptor_->name());
  printer->Indent();

  printer->Print("protected $classname$() {}\n\n", "classname",
                 descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
      "public static final\n"
      "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
      "    getDescriptor() {\n"
      "  return $file$.getDescriptor().getServices().get($index$);\n"
      "}\n",
      "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "index", absl::StrCat(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}